

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageFilledEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int y;
  long lVar9;
  int x;
  int x_00;
  long lVar10;
  bool bVar11;
  
  iVar3 = w >> 1;
  lVar9 = (long)iVar3;
  iVar1 = mx - iVar3;
  uVar7 = mx + lVar9;
  for (lVar10 = (long)iVar1; lVar10 <= (long)uVar7; lVar10 = lVar10 + 1) {
    gdImageSetPixel(im,(int)lVar10,my,c);
  }
  lVar4 = (long)(h >> 1) * (long)(h >> 1);
  lVar5 = lVar4 * lVar9;
  lVar10 = lVar5 * 2;
  lVar8 = 0;
  y = my;
  iVar2 = -2;
  do {
    if (iVar3 < 1) {
      return;
    }
    lVar6 = lVar5;
    if (lVar5 < 1) {
LAB_0010f001:
      iVar3 = iVar3 + -1;
      iVar1 = iVar1 + 1;
      uVar7 = (ulong)((int)uVar7 - 1);
      lVar10 = lVar10 + lVar4 * -2;
      lVar5 = lVar6 + lVar10;
    }
    else {
      y = y + 1;
      my = my + -1;
      lVar8 = lVar8 + lVar9 * lVar9 * 2;
      lVar6 = lVar5 - lVar8;
      bVar11 = lVar5 < lVar8;
      lVar5 = lVar6;
      if (lVar6 == 0 || bVar11) goto LAB_0010f001;
    }
    bVar11 = iVar2 != my;
    x = iVar1;
    iVar2 = my;
    if (bVar11) {
      for (; x_00 = iVar1, x <= (int)uVar7; x = x + 1) {
        gdImageSetPixel(im,x,y,c);
      }
      for (; x_00 <= (int)uVar7; x_00 = x_00 + 1) {
        gdImageSetPixel(im,x_00,my,c);
      }
    }
  } while( true );
}

Assistant:

BGD_DECLARE(void) gdImageFilledEllipse (gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;
	int i;
	int old_y2;

	a=w>>1;
	b=h>>1;

	for (x = mx-a; x <= mx+a; x++) {
		gdImageSetPixel(im, x, my, c);
	}

	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	old_y2=-2;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my1,c);
			}
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my2,c);
			}
		}
		old_y2 = my2;
	}
}